

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void GEO::CmdLine::set_arg(string *name,double value)

{
  ArgType AVar1;
  Environment *pEVar2;
  allocator local_62;
  allocator local_61;
  double local_60;
  string local_58;
  string local_38;
  
  local_60 = value;
  AVar1 = get_arg_type(name);
  if ((AVar1 & ~(ARG_PERCENT|ARG_STRING|ARG_DOUBLE)) == ARG_UNDEFINED) {
    pEVar2 = Environment::instance();
    String::to_string<double>(&local_58,&local_60);
    (*(pEVar2->super_Counted)._vptr_Counted[4])(pEVar2,name,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    return;
  }
  std::__cxx11::string::string
            ((string *)&local_58,"((type) & ~(ARG_DOUBLE | ARG_PERCENT | ARG_STRING)) == 0",
             &local_61);
  std::__cxx11::string::string
            ((string *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
             ,&local_62);
  geo_assertion_failed(&local_58,&local_38,0xb54);
}

Assistant:

void set_arg(const std::string& name, double value) {
            ArgType type = get_arg_type(name);
            geo_assert_arg_type(type, ARG_DOUBLE | ARG_PERCENT | ARG_STRING);
            Environment::instance()->set_value(name, String::to_string(value));
        }